

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_read_compressed_pixels
              (fitsfile *fptr,int datatype,LONGLONG fpixel,LONGLONG npixel,int nullcheck,
              void *nullval,void *array,char *nullarray,int *anynul,int *status)

{
  char *pcVar1;
  LONGLONG LVar2;
  char *local_1a8;
  char *nullarrayptr;
  char *arrayptr;
  LONGLONG lastcoord [6];
  LONGLONG firstcoord [6];
  LONGLONG dimsize [6];
  LONGLONG last1;
  LONGLONG last0;
  LONGLONG tlast;
  LONGLONG tfirst;
  long inc [6];
  long nplane;
  long nread;
  long naxes [6];
  int planenul;
  int bytesperpixel;
  int ii;
  int naxis;
  void *nullval_local;
  LONGLONG LStack_58;
  int nullcheck_local;
  LONGLONG npixel_local;
  LONGLONG fpixel_local;
  fitsfile *pfStack_40;
  int datatype_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    nullarrayptr = (char *)array;
    local_1a8 = nullarray;
    _ii = nullval;
    nullval_local._4_4_ = nullcheck;
    LStack_58 = npixel;
    npixel_local = fpixel;
    fpixel_local._4_4_ = datatype;
    pfStack_40 = fptr;
    naxes[5]._4_4_ = ffpxsz(datatype);
    for (planenul = 0; planenul < 6; planenul = planenul + 1) {
      naxes[(long)planenul + -1] = 1;
      lastcoord[(long)planenul + 5] = 0;
      lastcoord[(long)planenul + -1] = 0;
      inc[(long)planenul + -1] = 1;
    }
    ffgidm(pfStack_40,&bytesperpixel,status);
    ffgisz(pfStack_40,6,&nread,status);
    firstcoord[5] = 1;
    for (planenul = 1; planenul < 6; planenul = planenul + 1) {
      firstcoord[(long)planenul + 5] =
           firstcoord[(long)(planenul + -1) + 5] * naxes[(long)(planenul + -1) + -1];
    }
    tlast = npixel_local + -1;
    last0 = tlast + LStack_58 + -1;
    planenul = bytesperpixel;
    while (LVar2 = lastcoord[0], pcVar1 = arrayptr, planenul = planenul + -1, -1 < planenul) {
      lastcoord[(long)planenul + 5] = tlast / firstcoord[(long)planenul + 5];
      lastcoord[(long)planenul + -1] = last0 / firstcoord[(long)planenul + 5];
      tlast = tlast - lastcoord[(long)planenul + 5] * firstcoord[(long)planenul + 5];
      last0 = last0 - lastcoord[(long)planenul + -1] * firstcoord[(long)planenul + 5];
    }
    if (bytesperpixel == 1) {
      lastcoord[5] = lastcoord[5] + 1;
      arrayptr = arrayptr + 1;
      fits_read_compressed_img
                (pfStack_40,fpixel_local._4_4_,lastcoord + 5,(LONGLONG *)&arrayptr,&tfirst,
                 nullval_local._4_4_,_ii,array,nullarray,anynul,status);
      fptr_local._4_4_ = *status;
    }
    else {
      if (bytesperpixel == 2) {
        inc[5] = 0;
        fits_read_compressed_img_plane
                  (pfStack_40,fpixel_local._4_4_,naxes[5]._4_4_,0,lastcoord + 5,
                   (LONGLONG *)&arrayptr,&tfirst,&nread,nullval_local._4_4_,_ii,array,nullarray,
                   anynul,&nplane,status);
      }
      else {
        if (bytesperpixel != 3) {
          ffpmsg("only 1D, 2D, or 3D images are currently supported");
          *status = 0x19e;
          return 0x19e;
        }
        if ((((lastcoord[5] == 0) && (firstcoord[0] == 0)) && (arrayptr == (char *)(nread + -1))) &&
           (lastcoord[0] == naxes[0] + -1)) {
          for (planenul = 0; planenul < 6; planenul = planenul + 1) {
            lastcoord[(long)planenul + 5] = lastcoord[(long)planenul + 5] + 1;
            lastcoord[(long)planenul + -1] = lastcoord[(long)planenul + -1] + 1;
          }
          fits_read_compressed_img
                    (pfStack_40,fpixel_local._4_4_,lastcoord + 5,(LONGLONG *)&arrayptr,&tfirst,
                     nullval_local._4_4_,_ii,array,nullarray,anynul,status);
          return *status;
        }
        if (anynul != (int *)0x0) {
          *anynul = 0;
        }
        if (firstcoord[1] < lastcoord[1]) {
          arrayptr = (char *)(nread + -1);
          lastcoord[0] = naxes[0] + -1;
        }
        for (inc[5] = firstcoord[1]; inc[5] <= lastcoord[1]; inc[5] = inc[5] + 1) {
          if (inc[5] == lastcoord[1]) {
            arrayptr = pcVar1;
            lastcoord[0] = LVar2;
          }
          fits_read_compressed_img_plane
                    (pfStack_40,fpixel_local._4_4_,naxes[5]._4_4_,inc[5],lastcoord + 5,
                     (LONGLONG *)&arrayptr,&tfirst,&nread,nullval_local._4_4_,_ii,nullarrayptr,
                     local_1a8,(int *)(naxes + 5),&nplane,status);
          if (((int)naxes[5] != 0) && (anynul != (int *)0x0)) {
            *anynul = 1;
          }
          lastcoord[5] = 0;
          firstcoord[0] = 0;
          nullarrayptr = nullarrayptr + nplane * naxes[5]._4_4_;
          if ((local_1a8 != (char *)0x0) && (nullval_local._4_4_ == 2)) {
            local_1a8 = local_1a8 + nplane;
          }
        }
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_read_compressed_pixels(fitsfile *fptr, /* I - FITS file pointer    */
            int  datatype,  /* I - datatype of the array to be returned     */
            LONGLONG   fpixel, /* I - 'first pixel to read          */
            LONGLONG   npixel,  /* I - number of pixels to read      */
            int  nullcheck,  /* I - 0 for no null checking                   */
                              /*     1: set undefined pixels = nullval       */
                              /*     2: set nullarray=1 for undefined pixels */
            void *nullval,    /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of flags = 1 if nullcheck = 2     */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
   Read a consecutive set of pixels from a compressed image.  This routine
   interpretes the n-dimensional image as a long one-dimensional array. 
   This is actually a rather inconvenient way to read compressed images in
   general, and could be rather inefficient if the requested pixels to be
   read are located in many different image compression tiles.    

   The general strategy used here is to read the requested pixels in blocks
   that correspond to rectangular image sections.  
*/
{
    int naxis, ii, bytesperpixel, planenul;
    long naxes[MAX_COMPRESS_DIM], nread;
    long nplane, inc[MAX_COMPRESS_DIM];
    LONGLONG tfirst, tlast, last0, last1, dimsize[MAX_COMPRESS_DIM];
    LONGLONG firstcoord[MAX_COMPRESS_DIM], lastcoord[MAX_COMPRESS_DIM];
    char *arrayptr, *nullarrayptr;

    if (*status > 0)
        return(*status);

    arrayptr = (char *) array;
    nullarrayptr = nullarray;

    /* get size of array pixels, in bytes */
    bytesperpixel = ffpxsz(datatype);

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxes[ii] = 1;
        firstcoord[ii] = 0;
        lastcoord[ii] = 0;
        inc[ii] = 1;
    }

    /*  determine the dimensions of the image to be read */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, MAX_COMPRESS_DIM, naxes, status);

    /* calc the cumulative number of pixels in each successive dimension */
    dimsize[0] = 1;
    for (ii = 1; ii < MAX_COMPRESS_DIM; ii++)
         dimsize[ii] = dimsize[ii - 1] * naxes[ii - 1];

    /*  determine the coordinate of the first and last pixel in the image */
    /*  Use zero based indexes here */
    tfirst = fpixel - 1;
    tlast = tfirst + npixel - 1;
    for (ii = naxis - 1; ii >= 0; ii--)
    {
        firstcoord[ii] = tfirst / dimsize[ii];
        lastcoord[ii] =  tlast / dimsize[ii];
        tfirst = tfirst - firstcoord[ii] * dimsize[ii];
        tlast = tlast - lastcoord[ii] * dimsize[ii];
    }

    /* to simplify things, treat 1-D, 2-D, and 3-D images as separate cases */

    if (naxis == 1)
    {
        /* Simple: just read the requested range of pixels */

        firstcoord[0] = firstcoord[0] + 1;
        lastcoord[0] = lastcoord[0] + 1;
        fits_read_compressed_img(fptr, datatype, firstcoord, lastcoord, inc,
            nullcheck, nullval, array, nullarray, anynul, status);
        return(*status);
    }
    else if (naxis == 2)
    {
        nplane = 0;  /* read 1st (and only) plane of the image */

        fits_read_compressed_img_plane(fptr, datatype, bytesperpixel,
          nplane, firstcoord, lastcoord, inc, naxes, nullcheck, nullval,
          array, nullarray, anynul, &nread, status);
    }
    else if (naxis == 3)
    {
        /* test for special case: reading an integral number of planes */
        if (firstcoord[0] == 0 && firstcoord[1] == 0 &&
            lastcoord[0] == naxes[0] - 1 && lastcoord[1] == naxes[1] - 1)
        {
            for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
            {
                /* convert from zero base to 1 base */
                (firstcoord[ii])++;
                (lastcoord[ii])++;
            }

            /* we can read the contiguous block of pixels in one go */
            fits_read_compressed_img(fptr, datatype, firstcoord, lastcoord, inc,
                nullcheck, nullval, array, nullarray, anynul, status);

            return(*status);
        }

        if (anynul)
            *anynul = 0;  /* initialize */

        /* save last coordinate in temporary variables */
        last0 = lastcoord[0];
        last1 = lastcoord[1];

        if (firstcoord[2] < lastcoord[2])
        {
            /* we will read up to the last pixel in all but the last plane */
            lastcoord[0] = naxes[0] - 1;
            lastcoord[1] = naxes[1] - 1;
        }

        /* read one plane of the cube at a time, for simplicity */
        for (nplane = (long) firstcoord[2]; nplane <= lastcoord[2]; nplane++)
        {
            if (nplane == lastcoord[2])
            {
                lastcoord[0] = last0;
                lastcoord[1] = last1;
            }

            fits_read_compressed_img_plane(fptr, datatype, bytesperpixel,
              nplane, firstcoord, lastcoord, inc, naxes, nullcheck, nullval,
              arrayptr, nullarrayptr, &planenul, &nread, status);

            if (planenul && anynul)
               *anynul = 1;  /* there are null pixels */

            /* for all subsequent planes, we start with the first pixel */
            firstcoord[0] = 0;
            firstcoord[1] = 0;

            /* increment pointers to next elements to be read */
            arrayptr = arrayptr + nread * bytesperpixel;
            if (nullarrayptr && (nullcheck == 2) )
                nullarrayptr = nullarrayptr + nread;
        }
    }
    else
    {
        ffpmsg("only 1D, 2D, or 3D images are currently supported");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    return(*status);
}